

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O2

Event * __thiscall binlog::EventStream::nextEvent(EventStream *this,EntryStream *input)

{
  Range range_00;
  Range range_01;
  Range range_02;
  Range range_03;
  int iVar1;
  undefined4 extraout_var;
  unsigned_long eventSourceId;
  char *extraout_RDX;
  Range range;
  Range local_30;
  
  while( true ) {
    iVar1 = (*input->_vptr_EntryStream[2])(input);
    local_30._begin = (char *)CONCAT44(extraout_var,iVar1);
    if (local_30._begin == extraout_RDX) {
      return (Event *)0x0;
    }
    local_30._end = extraout_RDX;
    eventSourceId = Range::read<unsigned_long>(&local_30);
    if (-1 < (long)eventSourceId) break;
    if (eventSourceId == 0xfffffffffffffffd) {
      range_02._end = local_30._end;
      range_02._begin = local_30._begin;
      readClockSync(this,range_02);
    }
    else if (eventSourceId == 0xfffffffffffffffe) {
      range_01._end = local_30._end;
      range_01._begin = local_30._begin;
      readWriterProp(this,range_01);
    }
    else if (eventSourceId == 0xffffffffffffffff) {
      range_00._end = local_30._end;
      range_00._begin = local_30._begin;
      readEventSource(this,range_00);
    }
  }
  range_03._end = local_30._end;
  range_03._begin = local_30._begin;
  readEvent(this,eventSourceId,range_03);
  return &this->_event;
}

Assistant:

const Event* EventStream::nextEvent(EntryStream& input)
{
  while (true)
  {
    Range range = input.nextEntryPayload();
    if (range.empty()) { return nullptr; }

    const std::uint64_t tag = range.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      switch (tag)
      {
        case EventSource::Tag:
          readEventSource(range);
          break;
        case WriterProp::Tag:
          readWriterProp(range);
          break;
        case ClockSync::Tag:
          readClockSync(range);
          break;
        // default: ignore unkown special entries
        // to be forward compatible.
      }
    }
    else
    {
      readEvent(tag, range);
      return &_event;
    }
  }
}